

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeRegistry.h
# Opt level: O2

bool __thiscall
anurbs::TypeEntry<anurbs::BrepTrim,_anurbs::Model>::save
          (TypeEntry<anurbs::BrepTrim,_anurbs::Model> *this,Model *model,size_t index,Json *target)

{
  element_type *peVar1;
  BrepTrim *data;
  bool bVar2;
  Model *model_00;
  Ref<anurbs::BrepTrim> entry;
  __shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2> local_38;
  pointer local_28;
  
  Model::get<anurbs::BrepTrim>((Model *)&stack0xffffffffffffffd8,(size_t)model);
  if (local_28 != (pointer)0x0) {
    std::__shared_ptr<anurbs::BrepTrim,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<anurbs::BrepTrim,_(__gnu_cxx::_Lock_policy)2> *)&local_38,
               (__shared_ptr<anurbs::BrepTrim,_(__gnu_cxx::_Lock_policy)2> *)
               &local_28[2].super___shared_ptr<anurbs::EntryBase,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    peVar1 = local_38._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
    if (peVar1 != (Attributes *)0x0) {
      model_00 = (Model *)&stack0xffffffffffffffd8;
      data = Ref<anurbs::BrepTrim>::operator*((Ref<anurbs::BrepTrim> *)model_00);
      BrepTrim::save(model_00,data,target);
      std::__shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_38,
                 (__shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2> *)
                 &local_28[3].super___shared_ptr<anurbs::EntryBase,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      Attributes::
      save<anurbs::Model,nlohmann::basic_json<anurbs::FiFoMap,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                (local_38._M_ptr,model,target);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
      bVar2 = true;
      goto LAB_00205bfc;
    }
  }
  bVar2 = false;
LAB_00205bfc:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe0);
  return bVar2;
}

Assistant:

bool save(const TModel& model, const size_t index, Json& target) override
    {
        const auto entry = model.template get<TData>(index);

        if (entry.is_empty() || entry.data() == nullptr) {
            return false;
        }

        TData::save(model, *entry, target);
        entry.attributes()->save(model, target);

        return true;
    }